

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Relay.cpp
# Opt level: O1

void __thiscall RenX_RelayPlugin::RenX_OnRaw(RenX_RelayPlugin *this,Server *server,string_view line)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong uVar2;
  upstream_server_info *puVar3;
  _Elt_pointer ppuVar4;
  size_type sVar5;
  char __c;
  pointer pbVar6;
  __type_conflict1 _Var7;
  int iVar8;
  char *begin;
  ulong uVar9;
  __node_base_ptr p_Var10;
  __node_base_ptr p_Var11;
  long lVar12;
  size_type __rlen;
  upstream_server_info *puVar13;
  size_t sVar14;
  long lVar15;
  _Hash_node_base *p_Var16;
  string_view in_message;
  undefined1 auVar17 [16];
  __hash_code __code;
  container_type_conflict tokens;
  string line_sanitized;
  container_type_conflict local_88;
  char *local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  __c = (char)RenX::DelimC;
  begin = line._M_str;
  jessilib::split<std::vector,_const_char_*,_const_char_*,_char>
            (&local_88,begin,begin + line._M_len,(char)RenX::DelimC);
  if (local_88.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_88.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar2 = (this->m_server_info_map)._M_h._M_bucket_count;
    uVar9 = (ulong)server % uVar2;
    p_Var10 = (this->m_server_info_map)._M_h._M_buckets[uVar9];
    p_Var11 = (__node_base_ptr)0x0;
    if ((p_Var10 != (__node_base_ptr)0x0) &&
       (p_Var16 = p_Var10->_M_nxt, p_Var11 = p_Var10, (Server *)p_Var10->_M_nxt[1]._M_nxt != server)
       ) {
      while (p_Var10 = p_Var16, p_Var16 = p_Var10->_M_nxt, p_Var16 != (_Hash_node_base *)0x0) {
        p_Var11 = (__node_base_ptr)0x0;
        if (((ulong)p_Var16[1]._M_nxt % uVar2 != uVar9) ||
           (p_Var11 = p_Var10, (Server *)p_Var16[1]._M_nxt == server)) goto LAB_0012607b;
      }
      p_Var11 = (__node_base_ptr)0x0;
    }
LAB_0012607b:
    if (p_Var11 == (__node_base_ptr)0x0) {
      p_Var16 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var16 = p_Var11->_M_nxt;
    }
    if (p_Var16 != (_Hash_node_base *)0x0) {
      if ((((0x80 < (ulong)((long)local_88.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_88.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)) &&
           (iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::compare(local_88.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,"lRCON"), iVar8 == 0)) &&
          (iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   compare(local_88.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + 1,"Command;"), iVar8 == 0))
         && ((iVar8 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                (local_88.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + 3,"executed:"),
             iVar8 == 0 &&
             (local_88.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[4]._M_string_length != 0)))) {
        auVar17 = RenX::Server::getRCONUsername();
        pbVar6 = local_88.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        sVar14 = auVar17._0_8_;
        if ((sVar14 == local_88.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[2]._M_string_length) &&
           ((sVar14 == 0 ||
            (iVar8 = bcmp(auVar17._8_8_,
                          local_88.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p,sVar14),
            iVar8 == 0)))) {
          ppuVar4 = (this->m_command_tracker).
                    super__Deque_base<RenX_RelayPlugin::upstream_server_info_*,_std::allocator<RenX_RelayPlugin::upstream_server_info_*>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur;
          if (((this->m_command_tracker).
               super__Deque_base<RenX_RelayPlugin::upstream_server_info_*,_std::allocator<RenX_RelayPlugin::upstream_server_info_*>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur != ppuVar4) &&
             (((puVar13 = *ppuVar4, puVar13 != (upstream_server_info *)0x0 &&
               (puVar13->m_processing_command == false)) &&
              (_Var7 = std::operator==(pbVar6 + 4,
                                       &((puVar13->m_response_queue).
                                         super__Deque_base<RenX_RelayPlugin::UpstreamCommand,_std::allocator<RenX_RelayPlugin::UpstreamCommand>_>
                                         ._M_impl.super__Deque_impl_data._M_start._M_cur)->m_command
                                      ), _Var7)))) {
            puVar13->m_processing_command = true;
            paVar1 = &local_68.field_2;
            local_68._M_string_length = 0;
            local_68.field_2._M_local_buf[0] = '\0';
            sVar5 = (puVar13->m_settings->m_rcon_username)._M_string_length;
            local_68._M_dataplus._M_p = (pointer)paVar1;
            if (sVar5 == 0) {
              auVar17 = RenX::Server::getRCONUsername();
            }
            else {
              auVar17._8_8_ = (puVar13->m_settings->m_rcon_username)._M_dataplus._M_p;
              auVar17._0_8_ = sVar5;
            }
            local_70 = auVar17._8_8_;
            sVar14 = auVar17._0_8_;
            auVar17 = RenX::Server::getRCONUsername();
            if ((sVar14 == auVar17._0_8_) &&
               ((sVar14 == 0 || (iVar8 = bcmp(local_70,auVar17._8_8_,sVar14), iVar8 == 0)))) {
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_replace(&local_68,0,local_68._M_string_length,begin,line._M_len);
            }
            else {
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_replace(local_88.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + 2,0,
                         local_88.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[2]._M_string_length,local_70,
                         sVar14);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_assign(&local_68,
                        local_88.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
              if ((long)local_88.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_88.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start != 0x20) {
                lVar12 = 1;
                lVar15 = 0x28;
                do {
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  push_back(&local_68,__c);
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  _M_append(&local_68,
                            *(char **)((long)local_88.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start + lVar15 + -8
                                      ),
                            *(size_type *)
                             ((long)&((local_88.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                             + lVar15));
                  lVar12 = lVar12 + 1;
                  lVar15 = lVar15 + 0x20;
                } while (lVar12 != (long)local_88.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_88.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 5);
              }
            }
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            push_back(&local_68,'\n');
            in_message._M_str = local_68._M_dataplus._M_p;
            in_message._M_len = local_68._M_string_length;
            send_upstream(this,puVar13,in_message,server);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p != paVar1) {
              operator_delete(local_68._M_dataplus._M_p,
                              CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                                       local_68.field_2._M_local_buf[0]) + 1);
            }
          }
          goto LAB_0012612f;
        }
        if ((this->m_default_settings).m_suppress_rcon_command_logs != false) goto LAB_0012612f;
      }
      puVar13 = (upstream_server_info *)p_Var16[2]._M_nxt;
      puVar3 = (upstream_server_info *)p_Var16[3]._M_nxt;
      if (puVar13 != puVar3) {
        do {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_48,&local_88);
          process_renx_message(this,server,puVar13,line,&local_48);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_48);
          puVar13 = puVar13 + 1;
        } while (puVar13 != puVar3);
      }
    }
  }
LAB_0012612f:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  return;
}

Assistant:

void RenX_RelayPlugin::RenX_OnRaw(RenX::Server &server, std::string_view line) {
	// Not parsing any escape sequences, so data gets sent upstream exactly as it's received here. Copy tokens where needed to process escape sequences.
	auto tokens = jessilib::split(std::string_view{line}, RenX::DelimC);

	// Ensure valid message received
	if (tokens.empty()) {
		return;
	}

	// Check that we already have a session for this server
	auto server_info_map_itr = m_server_info_map.find(&server);
	if (server_info_map_itr == m_server_info_map.end()) {
		// early out: server not yet registered (i.e: finished auth)
		return;
	}

	// Suppress unassociated command execution logs from going upstream
	if (tokens.size() >= 5
		&& tokens[0] == "lRCON"
		&& tokens[1] == "Command;"
		&& tokens[3] == "executed:"
		&& !tokens[4].empty()) {
		if (tokens[2] != server.getRCONUsername()) {
			if (m_default_settings.m_suppress_rcon_command_logs) { // TODO: move away from per-stream settings
				// Suppress RCON command logs from other RCON users
				return;
			}
		}
		else if (m_command_tracker.empty()) {
			// This command response wasn't requested by any current upstream connections; suppress it
			return;
		}
		else {
			upstream_server_info* front_server_info = m_command_tracker.front();
			if (front_server_info == nullptr
				|| front_server_info->m_processing_command
				|| tokens[4] != front_server_info->m_response_queue.front().m_command) {
				// This command response wasn't requested by any current upstream connections; suppress it
				return;
			}

			// This is the next command we're been waiting on; mark processing command and let this go through
			front_server_info->m_processing_command = true;

			// This is a command response for an upstream command; this is only relevant to one server: that server
			// Always echo the command back exactly as it was sent
			std::string line_sanitized;
			const auto& rcon_username = get_upstream_rcon_username(*front_server_info, server);
			if (rcon_username == server.getRCONUsername()) {
				// No need to recombine tokens
				line_sanitized = line;
			}
			else {
				// TODO: add assignment operators to Jupiter::string crap
				tokens[2] = rcon_username;

				// Construct line to send and send it
				line_sanitized = tokens[0];
				for (size_t index = 1; index != tokens.size(); ++index) {
					line_sanitized += RenX::DelimC;
					line_sanitized += tokens[index];
				}
			}
			line_sanitized += '\n';

			send_upstream(*front_server_info, line_sanitized, server);
			return;
		}
	}

	for (auto& server_info : server_info_map_itr->second) {
		// Pass tokens by copy so sanitizations can differ per-upstream
		// TODO: optimize to only copy when needed
		// TODO: only generate sanitized message once if all upstreams are configured the same (i.e: all match default)
		process_renx_message(server, server_info, line, tokens);
	}
}